

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_DefineObjectNameComputed(JSContext *ctx,JSValue obj,JSValue str,int flags)

{
  BOOL BVar1;
  JSAtom name;
  int iVar2;
  JSValue val;
  
  if (((int)obj.tag == -1) && (BVar1 = js_object_has_name((JSContext *)obj.u.ptr,obj), BVar1 == 0))
  {
    name = JS_ValueToAtom(ctx,str);
    if (name == 0) {
      return -1;
    }
    val = js_get_function_name(ctx,name);
    JS_FreeAtom(ctx,name);
    if ((int)val.tag == 6) {
      return -1;
    }
    iVar2 = JS_DefinePropertyValue(ctx,obj,0x36,val,1);
    if (iVar2 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int JS_DefineObjectNameComputed(JSContext *ctx, JSValueConst obj,
                                       JSValueConst str, int flags)
{
    if (JS_IsObject(obj) &&
        !js_object_has_name(ctx, obj)) {
        JSAtom prop;
        JSValue name_str;
        prop = JS_ValueToAtom(ctx, str);
        if (prop == JS_ATOM_NULL)
            return -1;
        name_str = js_get_function_name(ctx, prop);
        JS_FreeAtom(ctx, prop);
        if (JS_IsException(name_str))
            return -1;
        if (JS_DefinePropertyValue(ctx, obj, JS_ATOM_name, name_str, flags) < 0)
            return -1;
    }
    return 0;
}